

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::dht_direct_response_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_direct_response_alert *this)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  size_t sVar3;
  char msg [1050];
  address local_4a8;
  long *local_488 [2];
  long local_478 [2];
  string local_468;
  char local_448 [1064];
  
  if ((this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.base.sa_family == 2) {
    local_4a8._0_8_ =
         (ulong)(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v6.
                sin6_flowinfo << 0x20;
    local_4a8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_4a8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_4a8.ipv6_address_.scope_id_ = 0;
  }
  else {
    local_4a8.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 8);
    local_4a8.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 0x10);
    local_4a8.ipv6_address_.scope_id_ =
         (unsigned_long)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v6.sin6_scope_id;
    local_4a8.type_ = ipv6;
    local_4a8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  }
  boost::asio::ip::address::to_string_abi_cxx11_(&local_468,&local_4a8);
  _Var1._M_p = local_468._M_dataplus._M_p;
  if (this->m_response_size == 0) {
    snprintf(local_448,0x41a,"DHT direct response (address=%s) [ %s ]",local_468._M_dataplus._M_p,""
            );
  }
  else {
    pcVar2 = aux::stack_allocator::ptr
                       ((this->m_alloc)._M_data,(allocation_slot)(this->m_response_idx).m_idx);
    local_488[0] = local_478;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,pcVar2,pcVar2 + this->m_response_size);
    snprintf(local_448,0x41a,"DHT direct response (address=%s) [ %s ]",_Var1._M_p,local_488[0]);
    if (local_488[0] != local_478) {
      operator_delete(local_488[0],local_478[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_448);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_448,local_448 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_direct_response_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[1050];
		std::snprintf(msg, sizeof(msg), "DHT direct response (address=%s) [ %s ]"
			, endpoint.address().to_string().c_str()
			, m_response_size ? std::string(m_alloc.get().ptr(m_response_idx)
				, aux::numeric_cast<std::size_t>(m_response_size)).c_str() : "");
		return msg;
#endif
	}